

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPMuxError MuxImageGetNth(WebPMuxImage **wpi_list,uint32_t nth,WebPMuxImage **wpi)

{
  WebPMuxImage *current;
  WebPMuxImage *pWVar1;
  WebPMuxImage **ppWVar2;
  WebPMuxImage **ppWVar3;
  bool bVar4;
  
  ppWVar2 = wpi_list;
  if (nth == 0) {
    nth = 0;
    for (pWVar1 = *wpi_list; pWVar1 != (WebPMuxImage *)0x0; pWVar1 = pWVar1->next) {
      nth = nth + 1;
    }
    if (nth == 0) {
      bVar4 = true;
      goto LAB_0014ef33;
    }
  }
  do {
    bVar4 = *wpi_list == (WebPMuxImage *)0x0;
    if (bVar4) break;
    ppWVar3 = &(*wpi_list)->next;
    if (nth != 1) {
      wpi_list = ppWVar3;
      ppWVar2 = ppWVar3;
    }
    nth = nth - 1;
  } while (nth != 0);
LAB_0014ef33:
  if (!bVar4) {
    *wpi = *ppWVar2;
  }
  return (uint)!bVar4;
}

Assistant:

static int SearchImageToGetOrDelete(WebPMuxImage** wpi_list, uint32_t nth,
                                    WebPMuxImage*** const location) {
  uint32_t count = 0;
  assert(wpi_list);
  *location = wpi_list;

  if (nth == 0) {
    nth = MuxImageCount(*wpi_list, WEBP_CHUNK_NIL);
    if (nth == 0) return 0;  // Not found.
  }

  while (*wpi_list != NULL) {
    WebPMuxImage* const cur_wpi = *wpi_list;
    ++count;
    if (count == nth) return 1;  // Found.
    wpi_list = &cur_wpi->next;
    *location = wpi_list;
  }
  return 0;  // Not found.
}